

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O1

void __thiscall cmXMLWriter::Doctype(cmXMLWriter *this,char *doctype)

{
  ostream *poVar1;
  size_t sVar2;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
  poVar1 = this->Output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<!DOCTYPE ",10);
  if (doctype == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(doctype);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,doctype,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  return;
}

Assistant:

void cmXMLWriter::Doctype(const char* doctype)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << "<!DOCTYPE " << doctype << ">";
}